

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O0

MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)

{
  MPP_RET MVar1;
  uint local_84;
  RK_U32 local_80;
  uint local_7c;
  RK_U32 _out_13;
  RK_U32 wqm_size;
  RK_U32 size_id;
  RK_S32 _out_12;
  RK_S32 _out_11;
  RK_S32 _out_10;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_S32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  Avs2dPicHeader_t *ph;
  Avs2dSeqHeader_t *vsh;
  BitReadCtx_t *bitctx;
  RK_U32 val_temp;
  RK_U32 j;
  RK_U32 i;
  MPP_RET ret;
  Avs2dCtx_t *p_dec_local;
  
  j = 0;
  bitctx._0_4_ = 0;
  vsh = (Avs2dSeqHeader_t *)&p_dec->bitctx;
  ph = (Avs2dPicHeader_t *)&p_dec->vsh;
  __out_1 = &p_dec->ph;
  _i = p_dec;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_picture_header_comm");
  }
  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_2);
  vsh->seq_rps[0].reserved = MVar1;
  if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
  bitctx._0_4_ = _out_2;
  __out_1->enable_loop_filter = (byte)_out_2 ^ 1;
  if (__out_1->enable_loop_filter != '\0') {
    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_3);
    vsh->seq_rps[0].reserved = MVar1;
    if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
    __out_1->loop_filter_parameter_flag = (RK_U8)_out_3;
    if (__out_1->loop_filter_parameter_flag == '\0') {
      __out_1->alpha_c_offset = '\0';
      __out_1->beta_offset = '\0';
    }
    else {
      MVar1 = mpp_read_se((BitReadCtx_t *)vsh,&_out_4);
      vsh->seq_rps[0].reserved = MVar1;
      if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
      __out_1->alpha_c_offset = (RK_S8)_out_4;
      MVar1 = mpp_read_se((BitReadCtx_t *)vsh,&_out_5);
      vsh->seq_rps[0].reserved = MVar1;
      if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
      __out_1->beta_offset = (RK_S8)_out_5;
      if ((((__out_1->alpha_c_offset < -8) || ('\b' < __out_1->alpha_c_offset)) ||
          (__out_1->beta_offset < -8)) || ('\b' < __out_1->beta_offset)) {
        j = 0xffffffff;
        _mpp_log_l(2,"avs2d_ps","invalid alpha_c_offset/beta_offset.\n","parse_picture_header_comm")
        ;
        goto LAB_001b0816;
      }
    }
  }
  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_6);
  vsh->seq_rps[0].reserved = MVar1;
  if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
  bitctx._0_4_ = _out_6;
  __out_1->enable_chroma_quant_param = (byte)_out_6 ^ 1;
  if (__out_1->enable_chroma_quant_param == '\0') {
    __out_1->chroma_quant_param_delta_cb = '\0';
    __out_1->chroma_quant_param_delta_cr = '\0';
  }
  else {
    MVar1 = mpp_read_se((BitReadCtx_t *)vsh,&_out_7);
    vsh->seq_rps[0].reserved = MVar1;
    if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
    __out_1->chroma_quant_param_delta_cb = (RK_S8)_out_7;
    MVar1 = mpp_read_se((BitReadCtx_t *)vsh,&_out_8);
    vsh->seq_rps[0].reserved = MVar1;
    if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
    __out_1->chroma_quant_param_delta_cr = (RK_S8)_out_8;
  }
  if (((__out_1->chroma_quant_param_delta_cb < -0x10) ||
      ('\x10' < __out_1->chroma_quant_param_delta_cb)) ||
     ((__out_1->chroma_quant_param_delta_cr < -0x10 ||
      ('\x10' < __out_1->chroma_quant_param_delta_cr)))) {
    j = 0xffffffff;
    _mpp_log_l(2,"avs2d_ps","invalid chrome quant param delta.\n","parse_picture_header_comm");
  }
  else {
    _i->enable_wq = '\0';
    if (ph->picture_output_delay != '\0') {
      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_9);
      vsh->seq_rps[0].reserved = MVar1;
      if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
      __out_1->enable_pic_weight_quant = (RK_U8)_out_9;
      if (__out_1->enable_pic_weight_quant != '\0') {
        _i->enable_wq = '\x01';
        MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,2,&_out_10);
        vsh->seq_rps[0].reserved = MVar1;
        if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
        __out_1->pic_wq_data_index = (RK_U8)_out_10;
        if (__out_1->pic_wq_data_index == '\x01') {
          MVar1 = mpp_skip_longbits((BitReadCtx_t *)vsh,1);
          vsh->seq_rps[0].reserved = MVar1;
          if (vsh->seq_rps[0].reserved != 0) {
LAB_001b07d1:
            if ((avs2d_parse_debug & 8) != 0) {
              _mpp_log_l(4,"avs2d_ps","Out, Bit read Err","parse_picture_header_comm");
            }
            return vsh->seq_rps[0].reserved;
          }
          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,2,&_out_11);
          vsh->seq_rps[0].reserved = MVar1;
          if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
          __out_1->wq_param_index = (RK_U8)_out_11;
          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,2,&_out_12);
          vsh->seq_rps[0].reserved = MVar1;
          if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
          __out_1->wq_model = (RK_U8)_out_12;
          if (__out_1->wq_param_index == '\x01') {
            for (val_temp = 0; val_temp < 6; val_temp = val_temp + 1) {
              MVar1 = mpp_read_se((BitReadCtx_t *)vsh,(RK_S32 *)&size_id);
              vsh->seq_rps[0].reserved = MVar1;
              if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
              __out_1->wq_param_delta1[val_temp] = size_id;
            }
          }
          else if (__out_1->wq_param_index == '\x02') {
            for (val_temp = 0; val_temp < 6; val_temp = val_temp + 1) {
              MVar1 = mpp_read_se((BitReadCtx_t *)vsh,(RK_S32 *)&wqm_size);
              vsh->seq_rps[0].reserved = MVar1;
              if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
              __out_1->wq_param_delta2[val_temp] = wqm_size;
            }
          }
        }
        else if (__out_1->pic_wq_data_index == '\x02') {
          for (_out_13 = 0; _out_13 < 2; _out_13 = _out_13 + 1) {
            if (1 << ((char)_out_13 + 2U & 0x1f) < 9) {
              local_84 = 1 << ((char)_out_13 + 2U & 0x1f);
            }
            else {
              local_84 = 8;
            }
            local_7c = local_84;
            for (bitctx._4_4_ = 0; bitctx._4_4_ < local_7c; bitctx._4_4_ = bitctx._4_4_ + 1) {
              for (val_temp = 0; val_temp < local_7c; val_temp = val_temp + 1) {
                MVar1 = mpp_read_ue((BitReadCtx_t *)vsh,&local_80);
                vsh->seq_rps[0].reserved = MVar1;
                if (vsh->seq_rps[0].reserved != 0) goto LAB_001b07d1;
                __out_1->pic_wq_matrix[_out_13][bitctx._4_4_ * local_7c + val_temp] = local_80;
              }
            }
          }
        }
      }
    }
    if ((ph->repeat_first_field == '\0') ||
       (j = parse_pic_alf_params((BitReadCtx_t *)vsh,__out_1), MPP_NOK < (int)j)) {
      if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_ps","Out, ret %d\n","parse_picture_header_comm",(ulong)j);
      }
      return j;
    }
    if ((avs2d_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x23c);
    }
  }
LAB_001b0816:
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Out, Failed","parse_picture_header_comm");
  }
  return j;
}

Assistant:

static MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, j;
    RK_U32 val_temp = 0;

    BitReadCtx_t *bitctx  = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_loop_filter = val_temp ^ 0x01;
    if (ph->enable_loop_filter) {
        READ_ONEBIT(bitctx, &ph->loop_filter_parameter_flag);
        if (ph->loop_filter_parameter_flag) {
            READ_SE(bitctx, &ph->alpha_c_offset);
            READ_SE(bitctx, &ph->beta_offset);
            if (ph->alpha_c_offset < -8 || ph->alpha_c_offset > 8 ||
                ph->beta_offset < -8 || ph->beta_offset > 8) {
                ret = MPP_NOK;
                mpp_err_f("invalid alpha_c_offset/beta_offset.\n");
                goto __FAILED;
            }
        } else {
            ph->alpha_c_offset = 0;
            ph->beta_offset    = 0;
        }
    }

    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_chroma_quant_param = val_temp ^ 0x01;
    if (ph->enable_chroma_quant_param) {
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cb);
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cr);
    } else {
        ph->chroma_quant_param_delta_cb = 0;
        ph->chroma_quant_param_delta_cr = 0;
    }
    if (ph->chroma_quant_param_delta_cb < -16 || ph->chroma_quant_param_delta_cb > 16 ||
        ph->chroma_quant_param_delta_cr < -16 || ph->chroma_quant_param_delta_cr > 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid chrome quant param delta.\n");
        goto __FAILED;
    }

    p_dec->enable_wq = 0;
    if (vsh->enable_weighted_quant) {
        READ_ONEBIT(bitctx, &ph->enable_pic_weight_quant);
        if (ph->enable_pic_weight_quant) {
            p_dec->enable_wq = 1;
            READ_BITS(bitctx, 2, &ph->pic_wq_data_index);
            if (ph->pic_wq_data_index == 1) {
                SKIP_BITS(bitctx, 1);
                READ_BITS(bitctx, 2, &ph->wq_param_index);
                READ_BITS(bitctx, 2, &ph->wq_model);
                if (ph->wq_param_index == 1) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta1[i]);
                    }
                } else if (ph->wq_param_index == 2) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta2[i]);
                    }
                }
            } else if (ph->pic_wq_data_index == 2) {
                RK_U32 size_id, wqm_size;
                for (size_id = 0; size_id < 2; size_id++) {
                    wqm_size = MPP_MIN(1 << (size_id + 2), 8);
                    for (j = 0; j < wqm_size; j++) {
                        for (i = 0; i < wqm_size; i++) {
                            READ_UE(bitctx, &ph->pic_wq_matrix[size_id][j * wqm_size + i]);
                        }
                    }
                }
            }

        }
    }

    if (vsh->enable_alf) {
        FUN_CHECK(ret = parse_pic_alf_params(bitctx, ph));
    }

    AVS2D_PARSE_TRACE("Out, ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out, Bit read Err");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out, Failed");
    return ret;
}